

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdflat.c
# Opt level: O3

void ngram_fwdflat_allocate_1ph(ngram_search_t *ngs)

{
  short sVar1;
  dict_t *pdVar2;
  dictword_t *pdVar3;
  bin_mdef_t *pbVar4;
  mdef_entry_t *pmVar5;
  int32 *piVar6;
  root_chan_t *prVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  ulong n_elem;
  long lVar11;
  long lVar12;
  
  pdVar2 = (ngs->base).dict;
  iVar9 = (ngs->base).n_words;
  lVar11 = (long)iVar9;
  n_elem = 0;
  ngs->n_1ph_words = 0;
  if (0 < lVar11) {
    pdVar3 = pdVar2->word;
    lVar8 = 0;
    do {
      if (*(int *)((long)&pdVar3->pronlen + lVar8) == 1) {
        uVar10 = (int)n_elem + 1;
        n_elem = (ulong)uVar10;
        ngs->n_1ph_words = uVar10;
      }
      lVar8 = lVar8 + 0x20;
    } while (lVar11 << 5 != lVar8);
    n_elem = (ulong)(int)n_elem;
  }
  piVar6 = (int32 *)__ckd_calloc__(n_elem,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                                   ,0x66);
  ngs->single_phone_wid = piVar6;
  prVar7 = (root_chan_t *)
           __ckd_calloc__((long)ngs->n_1ph_words,0x70,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdflat.c"
                          ,0x67);
  ngs->rhmm_1ph = prVar7;
  if (0 < iVar9) {
    lVar12 = 0;
    lVar8 = 0x10;
    iVar9 = 0;
    do {
      pdVar3 = pdVar2->word;
      if (*(int *)((long)&pdVar3->word + lVar8) == 1) {
        sVar1 = **(short **)((long)pdVar3 + lVar8 + -8);
        prVar7 = ngs->rhmm_1ph;
        prVar7[iVar9].ciphone = sVar1;
        pbVar4 = ((ngs->base).acmod)->mdef;
        prVar7[iVar9].ci2phone = (int16)pbVar4->sil;
        pmVar5 = pbVar4->phone;
        hmm_init(ngs->hmmctx,&prVar7[iVar9].hmm,1,pmVar5[sVar1].ssid,pmVar5[sVar1].tmat);
        prVar7 = ngs->rhmm_1ph;
        prVar7[iVar9].next = (chan_t *)0x0;
        ngs->word_chan[lVar12] = (chan_t *)(prVar7 + iVar9);
        ngs->single_phone_wid[iVar9] = (int32)lVar12;
        iVar9 = iVar9 + 1;
      }
      lVar12 = lVar12 + 1;
      lVar8 = lVar8 + 0x20;
    } while (lVar11 != lVar12);
  }
  return;
}

Assistant:

static void
ngram_fwdflat_allocate_1ph(ngram_search_t *ngs)
{
    dict_t *dict = ps_search_dict(ngs);
    int n_words = ps_search_n_words(ngs);
    int i, w;

    /* Allocate single-phone words, since they won't have
     * been allocated for us by fwdtree initialization. */
    ngs->n_1ph_words = 0;
    for (w = 0; w < n_words; w++) {
        if (dict_is_single_phone(dict, w))
            ++ngs->n_1ph_words;
    }
    ngs->single_phone_wid = ckd_calloc(ngs->n_1ph_words,
                                       sizeof(*ngs->single_phone_wid));
    ngs->rhmm_1ph = ckd_calloc(ngs->n_1ph_words, sizeof(*ngs->rhmm_1ph));
    i = 0;
    for (w = 0; w < n_words; w++) {
        if (!dict_is_single_phone(dict, w))
            continue;

        /* DICT2PID location */
        ngs->rhmm_1ph[i].ciphone = dict_first_phone(dict, w);
        ngs->rhmm_1ph[i].ci2phone = bin_mdef_silphone(ps_search_acmod(ngs)->mdef);
        hmm_init(ngs->hmmctx, &ngs->rhmm_1ph[i].hmm, TRUE,
                 /* ssid */ bin_mdef_pid2ssid(ps_search_acmod(ngs)->mdef,
                                              ngs->rhmm_1ph[i].ciphone),
                 /* tmatid */ bin_mdef_pid2tmatid(ps_search_acmod(ngs)->mdef,
    						  ngs->rhmm_1ph[i].ciphone));
        ngs->rhmm_1ph[i].next = NULL;
        ngs->word_chan[w] = (chan_t *) &(ngs->rhmm_1ph[i]);
        ngs->single_phone_wid[i] = w;
        i++;
    }
}